

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<double>_>::SolveBICGStab
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<Fad<double>_> *F,TPZFMatrix<Fad<double>_> *result,
          TPZFMatrix<Fad<double>_> *residual,REAL *tol,int FromCurrent)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZMatrix<Fad<double>>::SolveBICGStab(int64_t &, TPZSolver &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, TPZFMatrix<TVar> *, REAL &, const int) [T = Fad<double>]"
             ,0xb1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," is currently not implemented ",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"for this type\nAborting...",0x19);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x33d);
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt, std::list<int64_t> &singular) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B ,singular)  );
		case ECholesky:
			return( Solve_Cholesky( &B , singular)  );
		case ELDLt:
			return( Solve_LDLt( &B, singular )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}